

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGenerator::GetClangTidyReplacementsFilePath
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *directory,
          cmSourceFile *source,string *config)

{
  string *psVar1;
  cmLocalGenerator *this_00;
  cmLocalGenerator *pcVar2;
  string *a;
  string *fixesFile;
  char local_c3 [3];
  string *local_c0;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c0 = directory;
  local_b8 = __return_storage_ptr__;
  psVar1 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
  local_c3[0] = '/';
  this_00 = cmGeneratorTarget::GetLocalGenerator
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar2 = cmGeneratorTarget::GetLocalGenerator
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
  local_c3[2] = 0x2f;
  pcVar2 = cmGeneratorTarget::GetLocalGenerator
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  (*(pcVar2->super_cmOutputConverter)._vptr_cmOutputConverter[0x10])
            (&local_50,pcVar2,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_c3[1] = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[6]>
            (&local_b0,a,local_c3 + 2,&local_50,local_c3 + 1,psVar1,(char (*) [6])0x7df78b);
  cmOutputConverter::MaybeRelativeToTopBinDir(&local_90,&this_00->super_cmOutputConverter,&local_b0)
  ;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
            (&local_70,local_c0,local_c3,&local_90);
  psVar1 = local_b8;
  cmsys::SystemTools::CollapseFullPath(local_b8,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  return psVar1;
}

Assistant:

std::string cmMakefileTargetGenerator::GetClangTidyReplacementsFilePath(
  std::string const& directory, cmSourceFile const& source,
  std::string const& config) const
{
  (void)config;
  auto const& objectName = this->GeneratorTarget->GetObjectName(&source);
  auto fixesFile = cmSystemTools::CollapseFullPath(cmStrCat(
    directory, '/',
    this->GeneratorTarget->GetLocalGenerator()->MaybeRelativeToTopBinDir(
      cmStrCat(this->GeneratorTarget->GetLocalGenerator()
                 ->GetCurrentBinaryDirectory(),
               '/',
               this->GeneratorTarget->GetLocalGenerator()->GetTargetDirectory(
                 this->GeneratorTarget),
               '/', objectName, ".yaml"))));
  return fixesFile;
}